

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O1

DdNode * Cudd_zddDiffConst(DdManager *zdd,DdNode *P,DdNode *Q)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int iVar4;
  DdNode *pDVar5;
  
  pDVar5 = zdd->zero;
  if (pDVar5 == P) {
    return pDVar5;
  }
  if (pDVar5 == Q) {
    return P;
  }
  if (P == Q) {
    return pDVar5;
  }
  pDVar2 = cuddCacheLookup2Zdd(zdd,cuddZddDiff,P,Q);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  iVar1 = 0x7fffffff;
  iVar4 = 0x7fffffff;
  if ((ulong)P->index != 0x7fffffff) {
    iVar4 = zdd->permZ[P->index];
  }
  if ((ulong)Q->index != 0x7fffffff) {
    iVar1 = zdd->permZ[Q->index];
  }
  pDVar2 = (DdNode *)0x1;
  if (iVar1 <= iVar4) {
    if (iVar1 < iVar4) {
      pDVar5 = (Q->type).kids.E;
      pDVar2 = P;
    }
    else {
      pDVar3 = Cudd_zddDiffConst(zdd,(P->type).kids.T,(Q->type).kids.T);
      if (pDVar3 != pDVar5) goto LAB_007b78f7;
      pDVar2 = (P->type).kids.E;
      pDVar5 = (Q->type).kids.E;
    }
    pDVar2 = Cudd_zddDiffConst(zdd,pDVar2,pDVar5);
  }
LAB_007b78f7:
  cuddCacheInsert2(zdd,cuddZddDiff,P,Q,pDVar2);
  return pDVar2;
}

Assistant:

DdNode *
Cudd_zddDiffConst(
  DdManager * zdd,
  DdNode * P,
  DdNode * Q)
{
    int         p_top, q_top;
    DdNode      *empty = DD_ZERO(zdd), *t, *res;
    DdManager   *table = zdd;

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (Q == empty)
        return(P);
    if (P == Q)
        return(empty);

    /* Check cache.  The cache is shared by cuddZddDiff(). */
    res = cuddCacheLookup2Zdd(table, cuddZddDiff, P, Q);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P))
        p_top = P->index;
    else
        p_top = zdd->permZ[P->index];
    if (cuddIsConstant(Q))
        q_top = Q->index;
    else
        q_top = zdd->permZ[Q->index];
    if (p_top < q_top) {
        res = DD_NON_CONSTANT;
    } else if (p_top > q_top) {
        res = Cudd_zddDiffConst(zdd, P, cuddE(Q));
    } else {
        t = Cudd_zddDiffConst(zdd, cuddT(P), cuddT(Q));
        if (t != empty)
            res = DD_NON_CONSTANT;
        else
            res = Cudd_zddDiffConst(zdd, cuddE(P), cuddE(Q));
    }

    cuddCacheInsert2(table, cuddZddDiff, P, Q, res);

    return(res);

}